

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetMaxBetaFails(void *kinmem,long mxnbcf)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x2a3;
  }
  else {
    if (-1 < mxnbcf) {
      if (mxnbcf == 0) {
        *(undefined8 *)((long)kinmem + 0x50) = 10;
      }
      else {
        *(long *)((long)kinmem + 0x50) = mxnbcf;
      }
      return 0;
    }
    msgfmt = "mxbcf < 0 illegal.";
    iVar1 = -2;
    error_code = -2;
    line = 0x2ab;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetMaxBetaFails",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetMaxBetaFails(void* kinmem, long int mxnbcf)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (mxnbcf < 0)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_MXNBCF);
    return (KIN_ILL_INPUT);
  }

  if (mxnbcf == 0) { kin_mem->kin_mxnbcf = MXNBCF_DEFAULT; }
  else { kin_mem->kin_mxnbcf = mxnbcf; }

  return (KIN_SUCCESS);
}